

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc_keytype.cpp
# Opt level: O0

UBool isSpecialTypeRgKeyValue(char *val)

{
  UBool UVar1;
  char *local_28;
  char *p;
  int32_t subtagLen;
  char *val_local;
  
  p._4_4_ = 0;
  local_28 = val;
  while( true ) {
    if (*local_28 == '\0') {
      return p._4_4_ == 6;
    }
    if (((1 < p._4_4_) || (UVar1 = uprv_isASCIILetter_63(*local_28), UVar1 == '\0')) &&
       ((p._4_4_ < 2 || ((*local_28 != 'Z' && (*local_28 != 'z')))))) break;
    p._4_4_ = p._4_4_ + 1;
    local_28 = local_28 + 1;
  }
  return '\0';
}

Assistant:

static UBool
isSpecialTypeRgKeyValue(const char* val) {
    int32_t subtagLen = 0;
    const char* p = val;
    while (*p) {
        if ( (subtagLen < 2 && uprv_isASCIILetter(*p)) ||
                    (subtagLen >= 2 && (*p == 'Z' || *p == 'z')) ) {
            subtagLen++;
        } else {
            return FALSE;
        }
        p++;
    }
    return (subtagLen == 6);
}